

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*,char_const*>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end,char *in_whitespace_begin,char *in_whitespace_end)

{
  jessilib *pjVar1;
  char *pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_00;
  size_t sVar3;
  size_t sVar4;
  jessilib local_4b;
  jessilib local_4a;
  jessilib local_49;
  size_t local_48;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_40;
  jessilib *local_38;
  
  if ((long)in_whitespace_begin - (long)end._M_current == 1) {
    end_00._M_current._0_4_ = (uint)*end._M_current;
    end_00._M_current._4_4_ = 0;
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
              (__return_storage_ptr__,this,begin,end_00,(char)in_whitespace_begin);
    return __return_storage_ptr__;
  }
  if (begin._M_current <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char *)0x0;
    return __return_storage_ptr__;
  }
  if (end._M_current < in_whitespace_begin) {
    if (this != (jessilib *)begin._M_current) {
      do {
        local_4b = *this;
        pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (end._M_current,in_whitespace_begin,&local_4b);
        if (pcVar2 == in_whitespace_begin) break;
        this = this + 1;
      } while (this != (jessilib *)begin._M_current);
    }
    if (this < begin._M_current) {
      local_48 = (long)begin._M_current - (long)this;
      sVar4 = 0;
      do {
        local_4a = this[sVar4];
        pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                           (end._M_current,in_whitespace_begin,&local_4a);
        sVar3 = sVar4;
        local_40 = __return_storage_ptr__;
        local_38 = (jessilib *)begin._M_current;
        if (pcVar2 != in_whitespace_begin) goto LAB_0010eb17;
        sVar4 = sVar4 + 1;
      } while (local_48 != sVar4);
    }
  }
  (__return_storage_ptr__->first)._M_len = (long)begin._M_current - (long)this;
  (__return_storage_ptr__->first)._M_str = (char *)this;
  (__return_storage_ptr__->second)._M_len = 0;
  (__return_storage_ptr__->second)._M_str = (char *)0x0;
  return __return_storage_ptr__;
  while( true ) {
    local_49 = *pjVar1;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                       (end._M_current,in_whitespace_begin,&local_49);
    if (pcVar2 == in_whitespace_begin) break;
LAB_0010eb17:
    sVar3 = sVar3 + 1;
    pjVar1 = this + sVar3;
    if (pjVar1 == local_38) break;
  }
  (local_40->first)._M_len = sVar4;
  (local_40->first)._M_str = (char *)this;
  (local_40->second)._M_len = local_48 - sVar3;
  (local_40->second)._M_str = (char *)pjVar1;
  return local_40;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, SpaceItrT in_whitespace_begin, SpaceEndT in_whitespace_end) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using ElementT = std::remove_cvref_t<decltype(*begin)>;
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	if (std::distance(in_whitespace_begin, in_whitespace_end) == 1) {
		return word_split_once<OptionalMemberT...>(begin, end, *in_whitespace_begin);
	}

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	if (in_whitespace_begin >= in_whitespace_end) {
		// Absent whitespace, therefore no match, therefore return input as single token
		result.first = make_word_split_member<MemberT>(begin, end);
		return result;
	}

	auto is_whitespace = [in_whitespace_begin, in_whitespace_end](ElementT in_element) {
		return std::find(in_whitespace_begin, in_whitespace_end, in_element) != in_whitespace_end;
	};

	// Skip over preceeding whitespace
	while (begin != end
		&& is_whitespace(*begin)) {
		++begin;
	}

	for (auto itr = begin; itr < end; ++itr) {
		if (is_whitespace(*itr)) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& is_whitespace(*itr)) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}